

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# first_last_any.cpp
# Opt level: O1

AggregateFunction * __thiscall
duckdb::GetFirstFunction<false,false>
          (AggregateFunction *__return_storage_ptr__,duckdb *this,LogicalType *type)

{
  duckdb dVar1;
  reference pvVar2;
  LogicalType *type_00;
  AggregateFunction *function;
  LogicalType *this_00;
  FunctionNullHandling in_R8B;
  initializer_list<duckdb::LogicalType> __l;
  LogicalType local_1a0;
  allocator_type local_181;
  LogicalType local_180;
  undefined1 local_168 [24];
  undefined1 local_150 [48];
  undefined1 local_120 [24];
  undefined1 local_108 [24];
  undefined1 local_f0 [24];
  undefined1 local_d8 [24];
  undefined1 local_c0 [24];
  undefined1 local_a8 [24];
  undefined1 local_90 [24];
  undefined1 local_78 [24];
  undefined1 local_60 [24];
  undefined1 local_48 [48];
  
  if (*this == (duckdb)0x15) {
    LogicalType::Verify((LogicalType *)this);
    GetDecimalFirstFunction<false,false>(__return_storage_ptr__,this,type_00);
    pvVar2 = vector<duckdb::LogicalType,_true>::operator[]
                       (&(__return_storage_ptr__->super_BaseScalarFunction).super_SimpleFunction.
                         arguments,0);
    if (pvVar2 != (reference)this) {
      pvVar2->id_ = (LogicalTypeId)*this;
      pvVar2->physical_type_ = (PhysicalType)this[1];
      shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                (&pvVar2->type_info_,(shared_ptr<duckdb::ExtraTypeInfo,_true> *)(this + 8));
    }
    if (&(__return_storage_ptr__->super_BaseScalarFunction).return_type == (LogicalType *)this) {
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->super_BaseScalarFunction).return_type.id_ = (LogicalTypeId)*this;
    (__return_storage_ptr__->super_BaseScalarFunction).return_type.physical_type_ =
         (PhysicalType)this[1];
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              (&(__return_storage_ptr__->super_BaseScalarFunction).return_type.type_info_,
               (shared_ptr<duckdb::ExtraTypeInfo,_true> *)(this + 8));
    return __return_storage_ptr__;
  }
  dVar1 = this[1];
  if ((byte)dVar1 < 200) {
    switch(dVar1) {
    case (duckdb)0x1:
    case (duckdb)0x3:
      LogicalType::LogicalType((LogicalType *)local_48,(LogicalType *)this);
      LogicalType::LogicalType(&local_1a0,(LogicalType *)local_48);
      AggregateFunction::
      UnaryAggregate<duckdb::FirstState<signed_char>,signed_char,signed_char,duckdb::FirstFunction<false,false>,(duckdb::AggregateDestructorType)0>
                (__return_storage_ptr__,(AggregateFunction *)local_48,&local_1a0,(LogicalType *)0x0,
                 in_R8B);
      LogicalType::~LogicalType(&local_1a0);
      __return_storage_ptr__->simple_update = FirstFunctionSimpleUpdate<signed_char,false,false>;
      this_00 = (LogicalType *)local_48;
      break;
    case (duckdb)0x2:
      LogicalType::LogicalType((LogicalType *)local_a8,(LogicalType *)this);
      LogicalType::LogicalType(&local_1a0,(LogicalType *)local_a8);
      AggregateFunction::
      UnaryAggregate<duckdb::FirstState<unsigned_char>,unsigned_char,unsigned_char,duckdb::FirstFunction<false,false>,(duckdb::AggregateDestructorType)0>
                (__return_storage_ptr__,(AggregateFunction *)local_a8,&local_1a0,(LogicalType *)0x0,
                 in_R8B);
      LogicalType::~LogicalType(&local_1a0);
      __return_storage_ptr__->simple_update = FirstFunctionSimpleUpdate<unsigned_char,false,false>;
      this_00 = (LogicalType *)local_a8;
      break;
    case (duckdb)0x4:
      LogicalType::LogicalType((LogicalType *)local_c0,(LogicalType *)this);
      LogicalType::LogicalType(&local_1a0,(LogicalType *)local_c0);
      AggregateFunction::
      UnaryAggregate<duckdb::FirstState<unsigned_short>,unsigned_short,unsigned_short,duckdb::FirstFunction<false,false>,(duckdb::AggregateDestructorType)0>
                (__return_storage_ptr__,(AggregateFunction *)local_c0,&local_1a0,(LogicalType *)0x0,
                 in_R8B);
      LogicalType::~LogicalType(&local_1a0);
      __return_storage_ptr__->simple_update = FirstFunctionSimpleUpdate<unsigned_short,false,false>;
      this_00 = (LogicalType *)local_c0;
      break;
    case (duckdb)0x5:
      LogicalType::LogicalType((LogicalType *)local_60,(LogicalType *)this);
      LogicalType::LogicalType(&local_1a0,(LogicalType *)local_60);
      AggregateFunction::
      UnaryAggregate<duckdb::FirstState<short>,short,short,duckdb::FirstFunction<false,false>,(duckdb::AggregateDestructorType)0>
                (__return_storage_ptr__,(AggregateFunction *)local_60,&local_1a0,(LogicalType *)0x0,
                 in_R8B);
      LogicalType::~LogicalType(&local_1a0);
      __return_storage_ptr__->simple_update = FirstFunctionSimpleUpdate<short,false,false>;
      this_00 = (LogicalType *)local_60;
      break;
    case (duckdb)0x6:
      LogicalType::LogicalType((LogicalType *)local_d8,(LogicalType *)this);
      LogicalType::LogicalType(&local_1a0,(LogicalType *)local_d8);
      AggregateFunction::
      UnaryAggregate<duckdb::FirstState<unsigned_int>,unsigned_int,unsigned_int,duckdb::FirstFunction<false,false>,(duckdb::AggregateDestructorType)0>
                (__return_storage_ptr__,(AggregateFunction *)local_d8,&local_1a0,(LogicalType *)0x0,
                 in_R8B);
      LogicalType::~LogicalType(&local_1a0);
      __return_storage_ptr__->simple_update = FirstFunctionSimpleUpdate<unsigned_int,false,false>;
      this_00 = (LogicalType *)local_d8;
      break;
    case (duckdb)0x7:
      LogicalType::LogicalType((LogicalType *)local_78,(LogicalType *)this);
      LogicalType::LogicalType(&local_1a0,(LogicalType *)local_78);
      AggregateFunction::
      UnaryAggregate<duckdb::FirstState<int>,int,int,duckdb::FirstFunction<false,false>,(duckdb::AggregateDestructorType)0>
                (__return_storage_ptr__,(AggregateFunction *)local_78,&local_1a0,(LogicalType *)0x0,
                 in_R8B);
      LogicalType::~LogicalType(&local_1a0);
      __return_storage_ptr__->simple_update = FirstFunctionSimpleUpdate<int,false,false>;
      this_00 = (LogicalType *)local_78;
      break;
    case (duckdb)0x8:
      LogicalType::LogicalType((LogicalType *)local_f0,(LogicalType *)this);
      LogicalType::LogicalType(&local_1a0,(LogicalType *)local_f0);
      AggregateFunction::
      UnaryAggregate<duckdb::FirstState<unsigned_long>,unsigned_long,unsigned_long,duckdb::FirstFunction<false,false>,(duckdb::AggregateDestructorType)0>
                (__return_storage_ptr__,(AggregateFunction *)local_f0,&local_1a0,(LogicalType *)0x0,
                 in_R8B);
      LogicalType::~LogicalType(&local_1a0);
      __return_storage_ptr__->simple_update = FirstFunctionSimpleUpdate<unsigned_long,false,false>;
      this_00 = (LogicalType *)local_f0;
      break;
    case (duckdb)0x9:
      LogicalType::LogicalType((LogicalType *)local_90,(LogicalType *)this);
      LogicalType::LogicalType(&local_1a0,(LogicalType *)local_90);
      AggregateFunction::
      UnaryAggregate<duckdb::FirstState<long>,long,long,duckdb::FirstFunction<false,false>,(duckdb::AggregateDestructorType)0>
                (__return_storage_ptr__,(AggregateFunction *)local_90,&local_1a0,(LogicalType *)0x0,
                 in_R8B);
      LogicalType::~LogicalType(&local_1a0);
      __return_storage_ptr__->simple_update = FirstFunctionSimpleUpdate<long,false,false>;
      this_00 = (LogicalType *)local_90;
      break;
    default:
      goto switchD_00ece9f7_caseD_a;
    case (duckdb)0xb:
      LogicalType::LogicalType((LogicalType *)(local_150 + 0x18),(LogicalType *)this);
      LogicalType::LogicalType(&local_1a0,(LogicalType *)(local_150 + 0x18));
      AggregateFunction::
      UnaryAggregate<duckdb::FirstState<float>,float,float,duckdb::FirstFunction<false,false>,(duckdb::AggregateDestructorType)0>
                (__return_storage_ptr__,(AggregateFunction *)(local_150 + 0x18),&local_1a0,
                 (LogicalType *)0x0,in_R8B);
      LogicalType::~LogicalType(&local_1a0);
      __return_storage_ptr__->simple_update = FirstFunctionSimpleUpdate<float,false,false>;
      this_00 = (LogicalType *)(local_150 + 0x18);
      break;
    case (duckdb)0xc:
      LogicalType::LogicalType((LogicalType *)local_150,(LogicalType *)this);
      LogicalType::LogicalType(&local_1a0,(LogicalType *)local_150);
      AggregateFunction::
      UnaryAggregate<duckdb::FirstState<double>,double,double,duckdb::FirstFunction<false,false>,(duckdb::AggregateDestructorType)0>
                (__return_storage_ptr__,(AggregateFunction *)local_150,&local_1a0,(LogicalType *)0x0
                 ,in_R8B);
      LogicalType::~LogicalType(&local_1a0);
      __return_storage_ptr__->simple_update = FirstFunctionSimpleUpdate<double,false,false>;
      this_00 = (LogicalType *)local_150;
      break;
    case (duckdb)0x15:
      LogicalType::LogicalType((LogicalType *)local_168,(LogicalType *)this);
      LogicalType::LogicalType(&local_1a0,(LogicalType *)local_168);
      AggregateFunction::
      UnaryAggregate<duckdb::FirstState<duckdb::interval_t>,duckdb::interval_t,duckdb::interval_t,duckdb::FirstFunction<false,false>,(duckdb::AggregateDestructorType)0>
                (__return_storage_ptr__,(AggregateFunction *)local_168,&local_1a0,(LogicalType *)0x0
                 ,in_R8B);
      LogicalType::~LogicalType(&local_1a0);
      __return_storage_ptr__->simple_update =
           FirstFunctionSimpleUpdate<duckdb::interval_t,false,false>;
      this_00 = (LogicalType *)local_168;
    }
  }
  else {
    if (dVar1 == (duckdb)0xc8) {
      LogicalType::LogicalType((LogicalType *)(local_48 + 0x18),(LogicalType *)this);
      AggregateFunction::
      UnaryAggregate<duckdb::FirstState<duckdb::string_t>,duckdb::string_t,duckdb::string_t,duckdb::FirstFunctionString<false,false>,(duckdb::AggregateDestructorType)0>
                (__return_storage_ptr__,(AggregateFunction *)this,(LogicalType *)(local_48 + 0x18),
                 (LogicalType *)0x0,in_R8B);
      this_00 = (LogicalType *)(local_48 + 0x18);
      goto LAB_00ecef8c;
    }
    if (dVar1 == (duckdb)0xcb) {
      LogicalType::LogicalType((LogicalType *)local_120,(LogicalType *)this);
      LogicalType::LogicalType(&local_1a0,(LogicalType *)local_120);
      AggregateFunction::
      UnaryAggregate<duckdb::FirstState<duckdb::uhugeint_t>,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::FirstFunction<false,false>,(duckdb::AggregateDestructorType)0>
                (__return_storage_ptr__,(AggregateFunction *)local_120,&local_1a0,(LogicalType *)0x0
                 ,in_R8B);
      LogicalType::~LogicalType(&local_1a0);
      __return_storage_ptr__->simple_update =
           FirstFunctionSimpleUpdate<duckdb::uhugeint_t,false,false>;
      this_00 = (LogicalType *)local_120;
      goto LAB_00ecef8c;
    }
    if (dVar1 == (duckdb)0xcc) {
      LogicalType::LogicalType((LogicalType *)local_108,(LogicalType *)this);
      LogicalType::LogicalType(&local_1a0,(LogicalType *)local_108);
      AggregateFunction::
      UnaryAggregate<duckdb::FirstState<duckdb::hugeint_t>,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::FirstFunction<false,false>,(duckdb::AggregateDestructorType)0>
                (__return_storage_ptr__,(AggregateFunction *)local_108,&local_1a0,(LogicalType *)0x0
                 ,in_R8B);
      LogicalType::~LogicalType(&local_1a0);
      __return_storage_ptr__->simple_update =
           FirstFunctionSimpleUpdate<duckdb::hugeint_t,false,false>;
      this_00 = (LogicalType *)local_108;
      goto LAB_00ecef8c;
    }
switchD_00ece9f7_caseD_a:
    LogicalType::LogicalType(&local_180,(LogicalType *)this);
    __l._M_len = 1;
    __l._M_array = &local_180;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_1a0,__l,
               &local_181);
    AggregateFunction::AggregateFunction
              (__return_storage_ptr__,(vector<duckdb::LogicalType,_true> *)&local_1a0,
               (LogicalType *)this,
               AggregateFunction::StateSize<duckdb::FirstState<duckdb::string_t>>,
               AggregateFunction::
               StateInitialize<duckdb::FirstState<duckdb::string_t>,duckdb::FirstVectorFunction<false,false>,(duckdb::AggregateDestructorType)0>
               ,FirstVectorFunction<false,_false>::Update,
               AggregateFunction::
               StateCombine<duckdb::FirstState<duckdb::string_t>,duckdb::FirstVectorFunction<false,false>>
               ,AggregateFunction::
                StateVoidFinalize<duckdb::FirstState<duckdb::string_t>,duckdb::FirstVectorFunction<false,false>>
               ,(aggregate_simple_update_t)0x0,FirstVectorFunction<false,_false>::Bind,
               (aggregate_destructor_t)0x0,(aggregate_statistics_t)0x0,(aggregate_window_t)0x0,
               (aggregate_serialize_t)0x0,(aggregate_deserialize_t)0x0);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_1a0);
    this_00 = &local_180;
  }
LAB_00ecef8c:
  LogicalType::~LogicalType(this_00);
  return __return_storage_ptr__;
}

Assistant:

static AggregateFunction GetFirstFunction(const LogicalType &type) {
	if (type.id() == LogicalTypeId::DECIMAL) {
		type.Verify();
		AggregateFunction function = GetDecimalFirstFunction<LAST, SKIP_NULLS>(type);
		function.arguments[0] = type;
		function.return_type = type;
		return function;
	}
	switch (type.InternalType()) {
	case PhysicalType::BOOL:
	case PhysicalType::INT8:
		return GetFirstAggregateTemplated<int8_t, LAST, SKIP_NULLS>(type);
	case PhysicalType::INT16:
		return GetFirstAggregateTemplated<int16_t, LAST, SKIP_NULLS>(type);
	case PhysicalType::INT32:
		return GetFirstAggregateTemplated<int32_t, LAST, SKIP_NULLS>(type);
	case PhysicalType::INT64:
		return GetFirstAggregateTemplated<int64_t, LAST, SKIP_NULLS>(type);
	case PhysicalType::UINT8:
		return GetFirstAggregateTemplated<uint8_t, LAST, SKIP_NULLS>(type);
	case PhysicalType::UINT16:
		return GetFirstAggregateTemplated<uint16_t, LAST, SKIP_NULLS>(type);
	case PhysicalType::UINT32:
		return GetFirstAggregateTemplated<uint32_t, LAST, SKIP_NULLS>(type);
	case PhysicalType::UINT64:
		return GetFirstAggregateTemplated<uint64_t, LAST, SKIP_NULLS>(type);
	case PhysicalType::INT128:
		return GetFirstAggregateTemplated<hugeint_t, LAST, SKIP_NULLS>(type);
	case PhysicalType::UINT128:
		return GetFirstAggregateTemplated<uhugeint_t, LAST, SKIP_NULLS>(type);
	case PhysicalType::FLOAT:
		return GetFirstAggregateTemplated<float, LAST, SKIP_NULLS>(type);
	case PhysicalType::DOUBLE:
		return GetFirstAggregateTemplated<double, LAST, SKIP_NULLS>(type);
	case PhysicalType::INTERVAL:
		return GetFirstAggregateTemplated<interval_t, LAST, SKIP_NULLS>(type);
	case PhysicalType::VARCHAR:
		if (LAST) {
			return AggregateFunction::UnaryAggregateDestructor<FirstState<string_t>, string_t, string_t,
			                                                   FirstFunctionString<LAST, SKIP_NULLS>>(type, type);
		} else {
			return AggregateFunction::UnaryAggregate<FirstState<string_t>, string_t, string_t,
			                                         FirstFunctionString<LAST, SKIP_NULLS>>(type, type);
		}
	default: {
		using OP = FirstVectorFunction<LAST, SKIP_NULLS>;
		using STATE = FirstState<string_t>;
		return AggregateFunction(
		    {type}, type, AggregateFunction::StateSize<STATE>, AggregateFunction::StateInitialize<STATE, OP>,
		    OP::Update, AggregateFunction::StateCombine<STATE, OP>, AggregateFunction::StateVoidFinalize<STATE, OP>,
		    nullptr, OP::Bind, LAST ? AggregateFunction::StateDestroy<STATE, OP> : nullptr, nullptr, nullptr);
	}
	}
}